

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O3

Url * __thiscall
kj::Url::parse(Url *__return_storage_ptr__,Url *this,StringPtr url,Context context,Options options)

{
  bool bVar1;
  StringPtr text;
  StringPtr url_local;
  Maybe<kj::Url> local_2d0;
  NullableValue<kj::Url> _kj_result;
  Url local_f8;
  
  text.content.size_ = url.content.ptr;
  text.content.ptr = (char *)this;
  url_local.content.ptr = (char *)this;
  url_local.content.size_ = (size_t)text.content.size_;
  tryParse(&local_2d0,text,(Context)url.content.size_,SUB42(context,0));
  _kj_result.isSet = local_2d0.ptr.isSet;
  if (local_2d0.ptr.isSet == true) {
    Url(&_kj_result.field_1.value,&local_2d0.ptr.field_1.value);
  }
  if ((local_2d0.ptr.isSet & 1U) != 0) {
    ~Url(&local_2d0.ptr.field_1.value);
  }
  bVar1 = _kj_result.isSet;
  if (_kj_result.isSet != false) {
    Url(&local_f8,&_kj_result.field_1.value);
    if (_kj_result.isSet == true) {
      ~Url(&_kj_result.field_1.value);
    }
    Url(__return_storage_ptr__,&local_f8);
    if (bVar1 == true) {
      ~Url(&local_f8);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12],kj::StringPtr&>
            ((Fault *)&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
             ,0xa5,FAILED,"tryParse(url, context, options) != nullptr","\"invalid URL\", url",
             (char (*) [12])"invalid URL",&url_local);
  kj::_::Debug::Fault::fatal((Fault *)&local_2d0);
}

Assistant:

Url Url::parse(StringPtr url, Context context, Options options) {
  return KJ_REQUIRE_NONNULL(tryParse(url, context, options), "invalid URL", url);
}